

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool __thiscall
wallet::CCrypter::Decrypt
          (CCrypter *this,span<const_unsigned_char,_18446744073709551615UL> ciphertext,
          CKeyingMaterial *plaintext)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  bool bVar3;
  AES256CBCDecrypt dec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fKeySet == true) {
    std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize
              (plaintext,ciphertext._M_extent._M_extent_value._M_extent_value);
    AES256CBCDecrypt::AES256CBCDecrypt
              (&dec,(this->vchKey).
                    super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
               (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,true);
    iVar2 = AES256CBCDecrypt::Decrypt
                      (&dec,ciphertext._M_ptr,(int)ciphertext._M_extent._M_extent_value,
                       (plaintext->
                       super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start);
    bVar3 = iVar2 != 0;
    if (bVar3) {
      std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::resize(plaintext,(long)iVar2);
    }
    AES256CBCDecrypt::~AES256CBCDecrypt(&dec);
  }
  else {
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::Decrypt(const std::span<const unsigned char> ciphertext, CKeyingMaterial& plaintext) const
{
    if (!fKeySet)
        return false;

    // plaintext will always be equal to or lesser than length of ciphertext
    plaintext.resize(ciphertext.size());

    AES256CBCDecrypt dec(vchKey.data(), vchIV.data(), true);
    int len = dec.Decrypt(ciphertext.data(), ciphertext.size(), plaintext.data());
    if (len == 0) {
        return false;
    }
    plaintext.resize(len);
    return true;
}